

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slhdsa_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_9e2389::SLHDSATest_BasicNonstandardPrehashSignVerify_Test::TestBody
          (SLHDSATest_BasicNonstandardPrehashSignVerify_Test *this)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr;
  char *pcVar2;
  uint8_t *expected_predicate_value;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  uint8_t kWrongLengthHash [16];
  uint8_t pub [32];
  uint8_t kHashedMessage [48];
  uint8_t priv [64];
  uint8_t kContext [256];
  uint8_t signature [7856];
  AssertHelper local_20b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20b0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_20a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_20a0;
  AssertHelper local_2098;
  undefined1 local_2090 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2088;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2080;
  AssertHelper local_2070;
  uint8_t local_2068 [32];
  uint8_t local_2048 [112];
  uint8_t local_1fd8 [256];
  uint8_t local_1ed8 [7864];
  
  SLHDSA_SHA2_128S_generate_key(local_2068,local_2048 + 0x30);
  local_2048[8] = '\0';
  local_2048[9] = '\0';
  local_2048[10] = '\0';
  local_2048[0xb] = '\0';
  local_2048[0xc] = '\0';
  local_2048[0xd] = '\0';
  local_2048[0xe] = '\0';
  local_2048[0xf] = '\0';
  local_2048[0x20] = '\0';
  local_2048[0x21] = '\0';
  local_2048[0x22] = '\0';
  local_2048[0x23] = '\0';
  local_2048[0x24] = '\0';
  local_2048[0x25] = '\0';
  local_2048[0x26] = '\0';
  local_2048[0x27] = '\0';
  local_2048[0x28] = '\0';
  local_2048[0x29] = '\0';
  local_2048[0x2a] = '\0';
  local_2048[0x2b] = '\0';
  local_2048[0x2c] = '\0';
  local_2048[0x2d] = '\0';
  local_2048[0x2e] = '\0';
  local_2048[0x2f] = '\0';
  local_2048[0x10] = '\0';
  local_2048[0x11] = '\0';
  local_2048[0x12] = '\0';
  local_2048[0x13] = '\0';
  local_2048[0x14] = '\0';
  local_2048[0x15] = '\0';
  local_2048[0x16] = '\0';
  local_2048[0x17] = '\0';
  local_2048[0x18] = '\0';
  local_2048[0x19] = '\0';
  local_2048[0x1a] = '\0';
  local_2048[0x1b] = '\0';
  local_2048[0x1c] = '\0';
  local_2048[0x1d] = '\0';
  local_2048[0x1e] = '\0';
  local_2048[0x1f] = '\0';
  local_2048[0] = 'B';
  local_2048[1] = '\0';
  local_2048[2] = '\0';
  local_2048[3] = '\0';
  local_2048[4] = '\0';
  local_2048[5] = '\0';
  local_2048[6] = '\0';
  local_2048[7] = '\0';
  memset(local_1fd8,0,0x100);
  pcVar2 = (char *)0x0;
  iVar1 = SLHDSA_SHA2_128S_prehash_warning_nonstandard_sign
                    (local_1ed8,local_2048 + 0x30,local_2048,0x30,0x2a1,(uint8_t *)0x0,0);
  local_20a8._M_head_impl._0_1_ = iVar1 != 0;
  pbStack_20a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (iVar1 == 0) {
    testing::Message::Message((Message *)&local_20b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_2090,(internal *)&local_20a8,
               (AssertionResult *)
               "SLHDSA_SHA2_128S_prehash_warning_nonstandard_sign( signature, priv, kHashedMessage, sizeof(kHashedMessage), 673, nullptr, 0)"
               ,"false","true",pcVar2);
    testing::internal::AssertHelper::AssertHelper
              (&local_2098,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/slhdsa/slhdsa_test.cc"
               ,0x60,(char *)CONCAT71(local_2090._1_7_,local_2090[0]));
    testing::internal::AssertHelper::operator=(&local_2098,(Message *)&local_20b8);
  }
  else {
    iVar1 = SLHDSA_SHA2_128S_prehash_warning_nonstandard_verify
                      (local_1ed8,0x1eb0,local_2068,local_2048,0x30,0x2a1,(uint8_t *)0x0,0);
    local_20a8._M_head_impl._0_4_ = iVar1;
    local_20b8.data_._0_4_ = 1;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_2090,
               "SLHDSA_SHA2_128S_prehash_warning_nonstandard_verify( signature, sizeof(signature), pub, kHashedMessage, sizeof(kHashedMessage), 673, nullptr, 0)"
               ,"1",(int *)&local_20a8,(int *)&local_20b8);
    if (local_2090[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_20a8);
      if (local_2088 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = (local_2088->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_20b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/slhdsa/slhdsa_test.cc"
                 ,100,pcVar2);
      testing::internal::AssertHelper::operator=(&local_20b8,(Message *)&local_20a8);
      testing::internal::AssertHelper::~AssertHelper(&local_20b8);
      if (local_20a8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_20a8._M_head_impl + 8))();
      }
    }
    if (local_2088 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_2088,local_2088);
    }
    iVar1 = SLHDSA_SHA2_128S_prehash_warning_nonstandard_verify
                      (local_1ed8,0x1eb0,local_2068,local_2048,0x30,0x2a1,local_1fd8,1);
    local_20a8._M_head_impl._0_4_ = iVar1;
    local_20b8.data_._0_4_ = 0;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_2090,
               "SLHDSA_SHA2_128S_prehash_warning_nonstandard_verify( signature, sizeof(signature), pub, kHashedMessage, sizeof(kHashedMessage), 673, kContext, 1)"
               ,"0",(int *)&local_20a8,(int *)&local_20b8);
    if (local_2090[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_20a8);
      if (local_2088 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = (local_2088->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_20b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/slhdsa/slhdsa_test.cc"
                 ,0x68,pcVar2);
      testing::internal::AssertHelper::operator=(&local_20b8,(Message *)&local_20a8);
      testing::internal::AssertHelper::~AssertHelper(&local_20b8);
      if (local_20a8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_20a8._M_head_impl + 8))();
      }
    }
    if (local_2088 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_2088,local_2088);
    }
    iVar1 = SLHDSA_SHA2_128S_prehash_warning_nonstandard_verify
                      (local_1ed8,0x1eb0,local_2068,local_2048,0x30,0x2a1,local_1fd8,0x100);
    local_20a8._M_head_impl._0_4_ = iVar1;
    local_20b8.data_._0_4_ = 0;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_2090,
               "SLHDSA_SHA2_128S_prehash_warning_nonstandard_verify( signature, sizeof(signature), pub, kHashedMessage, sizeof(kHashedMessage), 673, kContext, 256)"
               ,"0",(int *)&local_20a8,(int *)&local_20b8);
    if (local_2090[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_20a8);
      if (local_2088 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = (local_2088->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_20b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/slhdsa/slhdsa_test.cc"
                 ,0x6c,pcVar2);
      testing::internal::AssertHelper::operator=(&local_20b8,(Message *)&local_20a8);
      testing::internal::AssertHelper::~AssertHelper(&local_20b8);
      if (local_20a8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_20a8._M_head_impl + 8))();
      }
    }
    if (local_2088 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_2088,local_2088);
    }
    expected_predicate_value = local_1fd8;
    iVar1 = SLHDSA_SHA2_128S_prehash_warning_nonstandard_sign
                      (local_1ed8,local_2048 + 0x30,local_2048,0x30,0x2a1,local_1fd8,1);
    local_20a8._M_head_impl._0_1_ = iVar1 != 0;
    pbStack_20a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 != 0) {
      iVar1 = SLHDSA_SHA2_128S_prehash_warning_nonstandard_verify
                        (local_1ed8,0x1eb0,local_2068,local_2048,0x30,0x2a1,local_1fd8,1);
      local_20a8._M_head_impl._0_4_ = iVar1;
      local_20b8.data_._0_4_ = 1;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_2090,
                 "SLHDSA_SHA2_128S_prehash_warning_nonstandard_verify( signature, sizeof(signature), pub, kHashedMessage, sizeof(kHashedMessage), 673, kContext, 1)"
                 ,"1",(int *)&local_20a8,(int *)&local_20b8);
      if (local_2090[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_20a8);
        if (local_2088 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          pcVar2 = "";
        }
        else {
          pcVar2 = (local_2088->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_20b8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/slhdsa/slhdsa_test.cc"
                   ,0x74,pcVar2);
        testing::internal::AssertHelper::operator=(&local_20b8,(Message *)&local_20a8);
        testing::internal::AssertHelper::~AssertHelper(&local_20b8);
        if (local_20a8._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_20a8._M_head_impl + 8))();
        }
      }
      if (local_2088 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_2088,local_2088);
      }
      local_20a8._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x42;
      pbStack_20a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      pcVar2 = (char *)0x0;
      iVar1 = SLHDSA_SHA2_128S_prehash_warning_nonstandard_sign
                        (local_1ed8,local_2048 + 0x30,(uint8_t *)&local_20a8,0x10,0x2a1,
                         (uint8_t *)0x0,0);
      local_20b8.data_._0_4_ = CONCAT31(local_20b8.data_._1_3_,iVar1 == 0);
      local_20b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar1 == 0) {
        return;
      }
      testing::Message::Message((Message *)&local_2098);
      this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_20b0;
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_2090,(internal *)&local_20b8,
                 (AssertionResult *)
                 "SLHDSA_SHA2_128S_prehash_warning_nonstandard_sign( signature, priv, kWrongLengthHash, sizeof(kWrongLengthHash), 673, nullptr, 0)"
                 ,"true","false",pcVar2);
      testing::internal::AssertHelper::AssertHelper
                (&local_2070,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/slhdsa/slhdsa_test.cc"
                 ,0x79,(char *)CONCAT71(local_2090._1_7_,local_2090[0]));
      testing::internal::AssertHelper::operator=(&local_2070,(Message *)&local_2098);
      testing::internal::AssertHelper::~AssertHelper(&local_2070);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_2090._1_7_,local_2090[0]) != &local_2080) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_2090._1_7_,local_2090[0]),
                        local_2080._M_allocated_capacity + 1);
      }
      __ptr = local_20b0;
      if (local_2098.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_2098.data_ + 8))();
        __ptr = local_20b0;
      }
      goto LAB_0036a65b;
    }
    testing::Message::Message((Message *)&local_20b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_2090,(internal *)&local_20a8,
               (AssertionResult *)
               "SLHDSA_SHA2_128S_prehash_warning_nonstandard_sign( signature, priv, kHashedMessage, sizeof(kHashedMessage), 673, kContext, 1)"
               ,"false","true",(char *)expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_2098,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/slhdsa/slhdsa_test.cc"
               ,0x70,(char *)CONCAT71(local_2090._1_7_,local_2090[0]));
    testing::internal::AssertHelper::operator=(&local_2098,(Message *)&local_20b8);
  }
  this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&pbStack_20a0;
  testing::internal::AssertHelper::~AssertHelper(&local_2098);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_2090._1_7_,local_2090[0]) != &local_2080) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_2090._1_7_,local_2090[0]),local_2080._M_allocated_capacity + 1
                   );
  }
  __ptr = pbStack_20a0;
  if ((long *)CONCAT44(local_20b8.data_._4_4_,local_20b8.data_._0_4_) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(local_20b8.data_._4_4_,local_20b8.data_._0_4_) + 8))();
    __ptr = pbStack_20a0;
  }
LAB_0036a65b:
  if (__ptr != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()(this_00,__ptr);
  }
  return;
}

Assistant:

TEST(SLHDSATest, BasicNonstandardPrehashSignVerify) {
  uint8_t pub[SLHDSA_SHA2_128S_PUBLIC_KEY_BYTES];
  uint8_t priv[SLHDSA_SHA2_128S_PRIVATE_KEY_BYTES];
  SLHDSA_SHA2_128S_generate_key(pub, priv);

  // Use a constant 48-byte value as the prehashed message
  uint8_t kHashedMessage[48] = {0x42};
  uint8_t kContext[256] = {0};
  uint8_t signature[SLHDSA_SHA2_128S_SIGNATURE_BYTES];
  ASSERT_TRUE(SLHDSA_SHA2_128S_prehash_warning_nonstandard_sign(
      signature, priv, kHashedMessage, sizeof(kHashedMessage), NID_sha384,
      nullptr, 0));
  EXPECT_EQ(SLHDSA_SHA2_128S_prehash_warning_nonstandard_verify(
                signature, sizeof(signature), pub, kHashedMessage,
                sizeof(kHashedMessage), NID_sha384, nullptr, 0),
            1);
  EXPECT_EQ(SLHDSA_SHA2_128S_prehash_warning_nonstandard_verify(
                signature, sizeof(signature), pub, kHashedMessage,
                sizeof(kHashedMessage), NID_sha384, kContext, 1),
            0);
  EXPECT_EQ(SLHDSA_SHA2_128S_prehash_warning_nonstandard_verify(
                signature, sizeof(signature), pub, kHashedMessage,
                sizeof(kHashedMessage), NID_sha384, kContext, 256),
            0);

  ASSERT_TRUE(SLHDSA_SHA2_128S_prehash_warning_nonstandard_sign(
      signature, priv, kHashedMessage, sizeof(kHashedMessage), NID_sha384,
      kContext, 1));
  EXPECT_EQ(SLHDSA_SHA2_128S_prehash_warning_nonstandard_verify(
                signature, sizeof(signature), pub, kHashedMessage,
                sizeof(kHashedMessage), NID_sha384, kContext, 1),
            1);

  uint8_t kWrongLengthHash[16] = {0x42};
  EXPECT_FALSE(SLHDSA_SHA2_128S_prehash_warning_nonstandard_sign(
      signature, priv, kWrongLengthHash, sizeof(kWrongLengthHash), NID_sha384,
      nullptr, 0));
}